

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O0

bool __thiscall
WorldShuffler::test_item_source_compatibility(WorldShuffler *this,ItemSource *source,Item *item)

{
  RandomizerWorld *this_00;
  ItemSource *this_01;
  bool bVar1;
  byte bVar2;
  uint8_t uVar3;
  string *id;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__x;
  reference ppIVar4;
  Item *pIVar5;
  ItemSource *source_in_node;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> sources_in_node;
  WorldNode *shop_node;
  ItemSourceOnGround *cast_source;
  Item *item_local;
  ItemSource *source_local;
  WorldShuffler *this_local;
  
  bVar1 = ItemSource::is_chest(source);
  if ((bVar1) || (bVar1 = ItemSource::is_npc_reward(source), bVar1)) {
    this_local._7_1_ = 1;
  }
  else {
    bVar2 = Item::id(item);
    if (bVar2 < 0x40) {
      bVar1 = ItemSource::is_shop_item(source);
      if (bVar1) {
        uVar3 = Item::id(item);
        if (uVar3 == '?') {
          this_local._7_1_ = 0;
          goto LAB_0023ed46;
        }
        this_00 = this->_world;
        id = ItemSource::node_id_abi_cxx11_(source);
        sources_in_node.super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)RandomizerWorld::node(this_00,id);
        __x = WorldNode::item_sources
                        ((WorldNode *)
                         sources_in_node.
                         super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::vector
                  ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&__range2,__x);
        __end2 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin
                           ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&__range2);
        source_in_node =
             (ItemSource *)
             std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end
                       ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&__range2);
        while (bVar1 = __gnu_cxx::
                       operator==<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                 (&__end2,(__normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                           *)&source_in_node), ((bVar1 ^ 0xffU) & 1) != 0) {
          ppIVar4 = __gnu_cxx::
                    __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                    ::operator*(&__end2);
          this_01 = *ppIVar4;
          if (((this_01 != source) && (bVar1 = ItemSource::is_shop_item(this_01), bVar1)) &&
             (pIVar5 = ItemSource::item(this_01), pIVar5 == item)) {
            this_local._7_1_ = 0;
            bVar1 = true;
            goto LAB_0023ed2c;
          }
          __gnu_cxx::
          __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
          ::operator++(&__end2);
        }
        bVar1 = false;
LAB_0023ed2c:
        std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::~vector
                  ((vector<ItemSource_*,_std::allocator<ItemSource_*>_> *)&__range2);
        if (bVar1) goto LAB_0023ed46;
      }
      this_local._7_1_ = 1;
    }
    else {
      this_local._7_1_ = 0;
    }
  }
LAB_0023ed46:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool WorldShuffler::test_item_source_compatibility(ItemSource* source, Item* item) const
{
    if(source->is_chest() || source->is_npc_reward())
        return true;

    ItemSourceOnGround* cast_source = reinterpret_cast<ItemSourceOnGround*>(source);
    if(item->id() >= ITEM_GOLDS_START)
        return false;

    if(source->is_shop_item())
    {
        if(item->id() == ITEM_NONE)
            return false;

        // If another shop source in the same node contains the same item, deny item placement
        WorldNode* shop_node = _world.node(source->node_id());
        const std::vector<ItemSource*> sources_in_node = shop_node->item_sources();
        for(ItemSource* source_in_node : sources_in_node)
            if(source_in_node != source && source_in_node->is_shop_item() && source_in_node->item() == item)
                return false;
    }

    return true;
}